

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoQuad>::TypeName_abi_cxx11_(TPZGeoElRefLess<pzgeom::TPZGeoQuad> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x64617551;
  in_RDI->_M_string_length = 4;
  (in_RDI->field_2)._M_local_buf[4] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }